

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_tcp_accept_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  if ((cf->field_0x24 & 1) == 0) {
    return CURLE_FAILED_INIT;
  }
  *done = true;
  return CURLE_OK;
}

Assistant:

static CURLcode cf_tcp_accept_connect(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      bool blocking, bool *done)
{
  /* we start accepted, if we ever close, we cannot go on */
  (void)data;
  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }
  return CURLE_FAILED_INIT;
}